

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum.hpp
# Opt level: O0

int magic_enum::detail::ualue<Color,0,(magic_enum::detail::enum_subtype)1,int>(size_t i)

{
  size_t i_local;
  
  return 1 << ((byte)i & 0x1f);
}

Assistant:

constexpr U ualue(std::size_t i) noexcept {
  if constexpr (std::is_same_v<U, bool>) { // bool special case
    static_assert(O == 0, "magic_enum::detail::ualue requires valid offset.");

    return static_cast<U>(i);
  } else if constexpr (S == enum_subtype::flags) {
    return static_cast<U>(U{1} << static_cast<U>(static_cast<int>(i) + O));
  } else {
    return static_cast<U>(static_cast<int>(i) + O);
  }
}